

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O0

nng_err http_scan_line(void *vbuf,size_t n,size_t *lenp)

{
  byte bVar1;
  uint8_t c;
  uint8_t *buf;
  ulong uStack_30;
  char lc;
  size_t len;
  size_t *lenp_local;
  size_t n_local;
  void *vbuf_local;
  
  buf._7_1_ = 0;
  uStack_30 = 0;
  while( true ) {
    if (n <= uStack_30) {
      return NNG_EAGAIN;
    }
    bVar1 = *(byte *)((long)vbuf + uStack_30);
    if (bVar1 == 10) break;
    if (((bVar1 < 0x20) && (bVar1 != 0xd)) || (buf._7_1_ == 0xd)) {
      return NNG_EPROTO;
    }
    uStack_30 = uStack_30 + 1;
    buf._7_1_ = bVar1;
  }
  if (buf._7_1_ == 0xd) {
    *(undefined1 *)((long)vbuf + (uStack_30 - 1)) = 0;
  }
  else {
    *(undefined1 *)((long)vbuf + uStack_30) = 0;
  }
  *lenp = uStack_30 + 1;
  return NNG_OK;
}

Assistant:

static nng_err
http_scan_line(void *vbuf, size_t n, size_t *lenp)
{
	size_t   len;
	char     lc;
	uint8_t *buf = vbuf;

	lc = 0;
	for (len = 0; len < n; len++) {
		uint8_t c = buf[len];
		if (c == '\n') {
			// Technically we should be receiving CRLF, but
			// debugging is easier with just LF, so we behave
			// following Postel's Law.
			if (lc != '\r') {
				buf[len] = '\0';
			} else {
				buf[len - 1] = '\0';
			}
			*lenp = len + 1;
			return (0);
		}
		// If we have a control character (other than CR), or a CR
		// followed by anything other than LF, then its an error.
		if (((c < ' ') && (c != '\r')) || (lc == '\r')) {
			return (NNG_EPROTO);
		}
		lc = c;
	}
	// Scanned the entire content, but did not find a line.
	return (NNG_EAGAIN);
}